

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void __thiscall asio::detail::thread_info_base::rethrow_pending_exception(thread_info_base *this)

{
  undefined8 uVar1;
  exception_ptr local_20;
  exception_ptr local_18;
  exception_ptr ex;
  thread_info_base *this_local;
  
  if (0 < this->has_pending_exception_) {
    this->has_pending_exception_ = 0;
    ex._M_exception_object = this;
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,&this->pending_exception_);
    std::__exception_ptr::exception_ptr::exception_ptr(&local_20,&local_18);
    uVar1 = std::rethrow_exception((exception_ptr)&local_20);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
    _Unwind_Resume(uVar1);
  }
  return;
}

Assistant:

void rethrow_pending_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    if (has_pending_exception_ > 0)
    {
      has_pending_exception_ = 0;
      std::exception_ptr ex(
          ASIO_MOVE_CAST(std::exception_ptr)(
            pending_exception_));
      std::rethrow_exception(ex);
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }